

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSwitch.c
# Opt level: O2

float Gia_ManComputeSwitching(Gia_Man_t *p,int nFrames,int nPref,int fProbOne)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar4;
  int iVar5;
  int *piVar6;
  long lVar7;
  float fVar8;
  
  p_00 = Gia_ManComputeSwitchProbs(p,nFrames,nPref,fProbOne);
  piVar6 = p_00->pArray;
  if (p->vMapping == (Vec_Int_t *)0x0) {
    fVar8 = 0.0;
    for (iVar5 = 0; iVar5 < p->nObjs; iVar5 = iVar5 + 1) {
      pGVar4 = Gia_ManObj(p,iVar5);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      uVar3 = (uint)*(undefined8 *)pGVar4;
      if ((~uVar3 & 0x1fffffff) != 0 && -1 < (int)uVar3) {
        fVar8 = fVar8 + *(float *)((long)piVar6 - (ulong)((uVar3 & 0x1fffffff) << 2)) +
                        *(float *)((long)piVar6 -
                                  (ulong)(((uint)((ulong)*(undefined8 *)pGVar4 >> 0x20) & 0x1fffffff
                                          ) << 2));
      }
      piVar6 = piVar6 + 1;
    }
  }
  else {
    fVar8 = 0.0;
    for (iVar5 = 1; iVar5 < p->nObjs; iVar5 = iVar5 + 1) {
      iVar2 = Vec_IntEntry(p->vMapping,iVar5);
      if (iVar2 != 0) {
        lVar7 = 0;
        while( true ) {
          pVVar1 = p->vMapping;
          iVar2 = Vec_IntEntry(pVVar1,iVar5);
          iVar2 = Vec_IntEntry(pVVar1,iVar2);
          if (iVar2 <= lVar7) break;
          pVVar1 = p->vMapping;
          uVar3 = Vec_IntEntry(pVVar1,iVar5);
          if (((int)uVar3 < 0) || (pVVar1->nSize <= (int)uVar3)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
          }
          fVar8 = fVar8 + (float)piVar6[pVVar1->pArray[(ulong)uVar3 + lVar7 + 1]];
          lVar7 = lVar7 + 1;
        }
      }
    }
  }
  Vec_IntFree(p_00);
  return fVar8;
}

Assistant:

float Gia_ManComputeSwitching( Gia_Man_t * p, int nFrames, int nPref, int fProbOne )
{
    Vec_Int_t * vSwitching = Gia_ManComputeSwitchProbs( p, nFrames, nPref, fProbOne );
    float * pSwi = (float *)Vec_IntArray(vSwitching), SwiTotal = 0;
    Gia_Obj_t * pObj;
    int i, k, iFan;
    if ( Gia_ManHasMapping(p) )
    {
        Gia_ManForEachLut( p, i )
            Gia_LutForEachFanin( p, i, iFan, k )
                SwiTotal += pSwi[iFan];
    }
    else
    {
        Gia_ManForEachAnd( p, pObj, i )
            SwiTotal += pSwi[Gia_ObjFaninId0(pObj, i)] + pSwi[Gia_ObjFaninId1(pObj, i)];
    }
    Vec_IntFree( vSwitching );
    return SwiTotal;
}